

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

KinDynComputations * __thiscall iDynTree::KinDynComputations::getBaseTwist(KinDynComputations *this)

{
  int iVar1;
  Twist *pTVar2;
  long in_RSI;
  
  iVar1 = *(int *)(*(long *)(in_RSI + 8) + 4);
  if (iVar1 == 1) {
    pTVar2 = (Twist *)iDynTree::FreeFloatingVel::baseVel();
    iDynTree::Twist::Twist((Twist *)this,pTVar2);
  }
  else if (iVar1 == 2) {
    iDynTree::FreeFloatingPos::worldBasePos();
    pTVar2 = (Twist *)iDynTree::Transform::getRotation();
    iDynTree::FreeFloatingVel::baseVel();
    iDynTree::Rotation::operator*((Rotation *)this,pTVar2);
  }
  else {
    pTVar2 = (Twist *)iDynTree::FreeFloatingPos::worldBasePos();
    iDynTree::FreeFloatingVel::baseVel();
    iDynTree::Transform::operator*((Transform *)this,pTVar2);
  }
  return this;
}

Assistant:

Twist KinDynComputations::getBaseTwist() const
{
    if (pimpl->m_frameVelRepr == MIXED_REPRESENTATION)
    {
        return pimpl->m_pos.worldBasePos().getRotation()*(pimpl->m_vel.baseVel());
    }
    else if (pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        // Data is stored in body fixed
        return pimpl->m_vel.baseVel();
    }
    else
    {
        assert(pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        // inertial_X_base \ls^base v_base
        return pimpl->m_pos.worldBasePos()*(pimpl->m_vel.baseVel());
    }

    assert(false);
    return Twist::Zero();
}